

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckSucceedsOnTrue::TestCheckSucceedsOnTrue
          (TestCheckSucceedsOnTrue *this)

{
  char *suiteName;
  TestCheckSucceedsOnTrue *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckSucceedsOnTrue",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,10);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestCheckSucceedsOnTrue_00182c00;
  return;
}

Assistant:

TEST(CheckSucceedsOnTrue)
{
    bool failure = true;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);

		ScopedCurrentTest scopedResults(testResults);
		CHECK(true);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(!failure);
}